

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Vec_Ptr_t * createArenaLi(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers,Vec_Ptr_t *vArenaSignal)

{
  int nCap;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pObjDriver;
  Aig_Obj_t *pObj;
  int i;
  int barrierCount;
  Vec_Ptr_t *vArenaLi;
  Vec_Ptr_t *vArenaSignal_local;
  Vec_Ptr_t *vBarriers_local;
  Aig_Man_t *pAigNew_local;
  
  if (vBarriers == (Vec_Ptr_t *)0x0) {
    pAigNew_local = (Aig_Man_t *)0x0;
  }
  else {
    nCap = Vec_PtrSize(vBarriers);
    if (nCap < 1) {
      pAigNew_local = (Aig_Man_t *)0x0;
    }
    else {
      pAigNew_local = (Aig_Man_t *)Vec_PtrAlloc(nCap);
      for (pObj._0_4_ = 0; (int)pObj < nCap; pObj._0_4_ = (int)pObj + 1) {
        pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(vArenaSignal,(int)pObj);
        pAVar1 = Aig_ObjCreateCo(pAigNew,pAVar1);
        Vec_PtrPush((Vec_Ptr_t *)pAigNew_local,pAVar1);
      }
    }
  }
  return (Vec_Ptr_t *)pAigNew_local;
}

Assistant:

Vec_Ptr_t * createArenaLi( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers, Vec_Ptr_t *vArenaSignal )
{
	Vec_Ptr_t *vArenaLi;
	int barrierCount;
	int i;
	Aig_Obj_t *pObj, *pObjDriver;

	if( vBarriers == NULL )
		return NULL;

	barrierCount = Vec_PtrSize(vBarriers);
	if( barrierCount <= 0 )
		return NULL;

	vArenaLi = Vec_PtrAlloc(barrierCount);	
	for( i=0; i<barrierCount; i++ )
	{
		pObjDriver = (Aig_Obj_t *)Vec_PtrEntry( vArenaSignal, i );
		pObj = Aig_ObjCreateCo( pAigNew, pObjDriver );
		Vec_PtrPush( vArenaLi, pObj );
	}

	return vArenaLi;
}